

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O0

void refittest(void)

{
  int N_00;
  int iVar1;
  double *xpred_00;
  double *amse_00;
  FILE *__stream;
  double *y;
  double *xreg_00;
  double *newxreg_00;
  sarimax_wrapper_object obj_00;
  double temp2 [1200];
  double temp1 [1200];
  double temp [1200];
  FILE *ifp;
  int seasonal [4];
  int order [3];
  int imean;
  sarimax_wrapper_object obj;
  double *newxreg;
  double *xreg;
  double *amse;
  double *xpred;
  int method;
  int biasadj;
  int drift;
  int r;
  int s;
  int Q;
  int P;
  int q;
  int p;
  double *inp;
  int L;
  int D;
  int d;
  int N;
  int i;
  
  seasonal[2] = 2;
  seasonal[3] = 1;
  ifp._0_4_ = 0;
  ifp._4_4_ = 0;
  seasonal[0] = 0;
  seasonal[1] = 0;
  xpred_00 = (double *)malloc(0);
  amse_00 = (double *)malloc(0);
  __stream = fopen("../data/seriesB.txt","r");
  d = 0;
  if (__stream != (FILE *)0x0) {
    while (N_00 = d, iVar1 = feof(__stream), iVar1 == 0) {
      __isoc99_fscanf(__stream,"%lf \n",temp1 + (long)d + 0x4af);
      d = d + 1;
    }
    y = (double *)malloc((long)d << 3);
    xreg_00 = (double *)malloc((long)d << 4);
    newxreg_00 = (double *)malloc(0);
    for (d = 0; d < N_00; d = d + 1) {
      y[d] = temp1[(long)d + 0x4af];
    }
    for (d = 0; d < 0; d = d + 1) {
      newxreg_00[d] = temp2[(long)(N_00 + d) + 0x4af];
      newxreg_00[d] = temp2[(long)(N_00 + d) + -1];
    }
    obj_00 = sarimax_wrapper((sarimax_wrapper_object)0x0,y,N_00,seasonal + 2,(int *)&ifp,
                             (double *)0x0,0,1,1,(double *)0x0,0,0);
    sarimax_wrapper_summary(obj_00);
    sarimax_wrapper_predict(obj_00,y,xreg_00,0,newxreg_00,xpred_00,amse_00);
    printf("\n");
    printf("Predicted Values : ");
    for (d = 0; d < 0; d = d + 1) {
      printf("%g ",xpred_00[d]);
    }
    printf("\n");
    printf("Standard Errors  : ");
    for (d = 0; d < 0; d = d + 1) {
      sqrt(amse_00[d]);
      printf("%g ");
    }
    printf("\n");
    sarimax_wrapper_free(obj_00);
    free(y);
    free(xpred_00);
    free(amse_00);
    free(xreg_00);
    free(newxreg_00);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void refittest() {
	int i, N, d, D, L;
	double *inp;
	int p, q, P, Q, s, r;
	int drift,biasadj,method;
	double *xpred, *amse,*xreg,*newxreg;
	sarimax_wrapper_object obj;
	int imean = 1;
    /*
    Make sure all the parameter values are correct and consistent with other values. eg., if xreg is NULL r should be 0
    or if P = D = Q = 0 then make sure that s is also 0. 
     Recheck the values if the program fails to execute.
    */
	p = 2;
	d = 1;
	q = 2;
	s = 0;
	P = 0;
	D = 0;
	Q = 0;
	r = 0;
	int order[3] = {p,d,q};
	int seasonal[4] = {P,D,Q,s};


	L = 0;

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];
    double temp1[1200];
    double temp2[1200];

	ifp = fopen("../data/seriesB.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}
	N = i - L;

	inp = (double*)malloc(sizeof(double)* N);
    xreg = (double*)malloc(sizeof(double)* N * 2);
    newxreg = (double*)malloc(sizeof(double)* L * 2);

    /*
    
    */

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
        //xreg[i] = temp1[i];
		//xreg[N+i] = temp2[i];
	}

    for(i = 0; i < L;++i) {
        newxreg[i] = temp1[N + i];
        newxreg[i+L] = temp2[N + i];
    }

	drift = 1;
	biasadj = 0;
	method = 0;

	//obj = sarimax_init(p, d, q, P, D, Q, s, r , N);
	obj = sarimax_wrapper(NULL,inp,N,order,seasonal,NULL,r,drift,imean,NULL,biasadj,method);

    /* setMethod()
    Method 0 ("CSS-MLE") is default. The method also accepts values 1 ("MLE") and 2 ("CSS")
    */

	//sarimax_setMethod(obj, 0); 

    /*sarimax_exec(object, input time series, exogenous time series)
        set exogenous to NULL if deadling only with a univariate time series.
    */
	//sarimax_exec(obj, inp,xreg);
	sarimax_wrapper_summary(obj);
	/* sarimax_predict(sarimax_object obj, double *inp, double *xreg, int L,double *newxreg, double *xpred, double *amse)
        inp - Input Time Series
        xreg - Exogenous Time Series
        L - L point prediction
        newxreg - Exogenous Time Series of dimension r * L where r is the number of exogenus time series and L is the length of each
        xpred - L future values
        amse - MSE for L future values
    */

	sarimax_wrapper_predict(obj, inp, xreg, L, newxreg, xpred, amse);
	printf("\n");
	printf("Predicted Values : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", xpred[i]);
	}
	printf("\n");
	printf("Standard Errors  : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", sqrt(amse[i]));
	}
	printf("\n");

	sarimax_wrapper_free(obj);
	free(inp);
	free(xpred);
	free(amse);
    free(xreg);
    free(newxreg);
}